

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctsa.c
# Opt level: O2

void arima_predict(arima_object obj,double *inp,int L,double *xpred,double *amse)

{
  uint d;
  uint N;
  uint ip;
  uint iq;
  double *C;
  double *W;
  double *resid;
  double *phi;
  double *theta;
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  double dVar4;
  double dVar5;
  
  d = obj->d;
  N = obj->N;
  ip = obj->p;
  iq = obj->q;
  C = (double *)malloc((long)(int)d * 8 + 8);
  W = (double *)malloc((long)(int)N * 8);
  resid = (double *)malloc((long)(int)N * 8);
  uVar3 = iq + 1;
  if ((int)(iq + 1) <= (int)ip) {
    uVar3 = ip;
  }
  phi = (double *)malloc((long)(int)uVar3 << 3);
  theta = (double *)malloc((long)(int)uVar3 << 3);
  if ((long)(int)d < 1) {
    *C = 1.0;
    dVar5 = obj->mean;
  }
  else {
    deld(d,C);
    dVar5 = 0.0;
  }
  uVar1 = 0;
  uVar2 = 0;
  if (0 < (int)d) {
    uVar2 = (ulong)d;
  }
  for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
    C[uVar1 + 1] = -C[uVar1 + 1];
  }
  uVar1 = 0;
  uVar2 = 0;
  if (0 < (int)N) {
    uVar2 = (ulong)N;
  }
  for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
    dVar4 = inp[uVar1];
    if (d == 0) {
      dVar4 = dVar4 - dVar5;
    }
    W[uVar1] = dVar4;
    resid[uVar1] = obj->res[uVar1];
  }
  uVar2 = 0;
  uVar1 = (ulong)uVar3;
  if ((int)uVar3 < 1) {
    uVar1 = uVar2;
  }
  for (; uVar1 != uVar2; uVar2 = uVar2 + 1) {
    theta[uVar2] = 0.0;
    phi[uVar2] = 0.0;
  }
  uVar1 = 0;
  uVar2 = 0;
  if (0 < (int)ip) {
    uVar2 = (ulong)ip;
  }
  for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
    phi[uVar1] = obj->phi[uVar1];
  }
  uVar2 = 0;
  uVar1 = 0;
  if (0 < (int)iq) {
    uVar1 = (ulong)iq;
  }
  for (; uVar1 != uVar2; uVar2 = uVar2 + 1) {
    theta[uVar2] = -obj->theta[uVar2];
  }
  forkal(ip,iq,d,phi,theta,C + 1,N,W,resid,L,xpred,amse);
  uVar2 = 0;
  uVar1 = (ulong)(uint)L;
  if (L < 1) {
    uVar1 = 0;
  }
  for (; uVar1 != uVar2; uVar2 = uVar2 + 1) {
    xpred[uVar2] = xpred[uVar2] + dVar5;
  }
  free(C);
  free(W);
  free(resid);
  free(phi);
  free(theta);
  return;
}

Assistant:

void arima_predict(arima_object obj,double *inp, int L,double *xpred,double *amse) {
	int d,i,N,ip,iq,ir;
	double *delta,*W,*resid,*phi,*theta;
	double wmean;

	d = obj->d;
	N = obj->N;
	ip = obj->p;
	iq = obj->q;
	delta = (double*)malloc(sizeof(double)* (d + 1));
	W = (double*)malloc(sizeof(double)* N);
	resid = (double*)malloc(sizeof(double)* N);

	ir = iq + 1;

	if (ir < ip) {
		ir = ip;
	}

	phi = (double*)malloc(sizeof(double)* ir);
	theta = (double*)malloc(sizeof(double)* ir);
	wmean = 0.0;
	if (d > 0) {
		deld(d, delta);
	}
	else {
		*delta = 1.0;
		wmean = obj->mean;
	}
	for (i = 1; i <= d; ++i) {
		delta[i] = -1.0 * delta[i];
	}
	for (i = 0; i < N; ++i) {
		W[i] = inp[i];
		if (d == 0) {
			W[i] -= wmean;
		}
		resid[i] = obj->res[i];
	}
	for (i = 0; i < ir; ++i) {
		phi[i] = theta[i] = 0.0;
	}

	for (i = 0; i < ip; ++i) {
		phi[i] = obj->phi[i];
	}

	for (i = 0; i < iq; ++i) {
		theta[i] = -1.0 *  obj->theta[i];
	}

	forkal(ip, iq, d, phi, theta, delta+1, N, W, resid, L, xpred, amse);

	for (i = 0; i < L; ++i) {
		xpred[i] += wmean;
	}

	free(delta);
	free(W);
	free(resid);
	free(phi);
	free(theta);
}